

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_aes_decrypt.c
# Opt level: O0

int tc_aes_decrypt(uint8_t *out,uint8_t *in,TCAesKeySched_t s)

{
  int local_3c;
  EVP_PKEY_CTX local_38 [4];
  uint i;
  uint8_t state [16];
  TCAesKeySched_t s_local;
  uint8_t *in_local;
  uint8_t *out_local;
  
  if (out == (uint8_t *)0x0) {
    out_local._4_4_ = 0;
  }
  else if (in == (uint8_t *)0x0) {
    out_local._4_4_ = 0;
  }
  else if (s == (TCAesKeySched_t)0x0) {
    out_local._4_4_ = 0;
  }
  else {
    state._8_8_ = s;
    _copy(local_38,(EVP_PKEY_CTX *)0x10);
    add_round_key((uint8_t *)local_38,(uint *)(state._8_8_ + 0xa0));
    for (local_3c = 9; local_3c != 0; local_3c = local_3c + -1) {
      inv_shift_rows((uint8_t *)local_38);
      inv_sub_bytes((uint8_t *)local_38);
      add_round_key((uint8_t *)local_38,(uint *)(state._8_8_ + (ulong)(uint)(local_3c << 2) * 4));
      inv_mix_columns((uint8_t *)local_38);
    }
    inv_shift_rows((uint8_t *)local_38);
    inv_sub_bytes((uint8_t *)local_38);
    add_round_key((uint8_t *)local_38,(uint *)state._8_8_);
    _copy((EVP_PKEY_CTX *)out,(EVP_PKEY_CTX *)0x10);
    _set(local_38,'\0',0x10);
    out_local._4_4_ = 1;
  }
  return out_local._4_4_;
}

Assistant:

int tc_aes_decrypt(uint8_t *out, const uint8_t *in, const TCAesKeySched_t s)
{
	uint8_t state[Nk*Nb];
	unsigned int i;

	if (out == (uint8_t *) 0) {
		return TC_CRYPTO_FAIL;
	} else if (in == (const uint8_t *) 0) {
		return TC_CRYPTO_FAIL;
	} else if (s == (TCAesKeySched_t) 0) {
		return TC_CRYPTO_FAIL;
	}

	(void)_copy(state, sizeof(state), in, sizeof(state));

	add_round_key(state, s->words + Nb*Nr);

	for (i = Nr - 1; i > 0; --i) {
		inv_shift_rows(state);
		inv_sub_bytes(state);
		add_round_key(state, s->words + Nb*i);
		inv_mix_columns(state);
	}

	inv_shift_rows(state);
	inv_sub_bytes(state);
	add_round_key(state, s->words);

	(void)_copy(out, sizeof(state), state, sizeof(state));

	/*zeroing out the state buffer */
	_set(state, TC_ZERO_BYTE, sizeof(state));


	return TC_CRYPTO_SUCCESS;
}